

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInstancesProcess.cpp
# Opt level: O2

bool CompareBones(aiMesh *orig,aiMesh *inst)

{
  uint uVar1;
  aiBone *paVar2;
  aiBone *paVar3;
  aiVertexWeight *paVar4;
  aiVertexWeight *paVar5;
  bool bVar6;
  uint n;
  ulong uVar7;
  uint i;
  uint uVar8;
  
  for (uVar8 = 0; uVar1 = orig->mNumBones, uVar8 < uVar1; uVar8 = uVar8 + 1) {
    paVar2 = orig->mBones[uVar8];
    paVar3 = inst->mBones[uVar8];
    if ((paVar2->mNumWeights != paVar3->mNumWeights) ||
       (bVar6 = aiMatrix4x4t<float>::operator!=(&paVar2->mOffsetMatrix,&paVar3->mOffsetMatrix),
       bVar6)) break;
    uVar7 = 0;
    while (paVar2->mNumWeights != uVar7) {
      if ((paVar2->mWeights[uVar7].mVertexId != paVar3->mWeights[uVar7].mVertexId) ||
         (paVar4 = paVar2->mWeights + uVar7, paVar5 = paVar3->mWeights + uVar7, uVar7 = uVar7 + 1,
         paVar4->mWeight - paVar5->mWeight < 0.01)) goto LAB_003b4499;
    }
  }
LAB_003b4499:
  return uVar1 <= uVar8;
}

Assistant:

bool CompareBones(const aiMesh* orig, const aiMesh* inst)
{
    for (unsigned int i = 0; i < orig->mNumBones;++i) {
        aiBone* aha = orig->mBones[i];
        aiBone* oha = inst->mBones[i];

        if (aha->mNumWeights   != oha->mNumWeights   ||
            aha->mOffsetMatrix != oha->mOffsetMatrix) {
            return false;
        }

        // compare weight per weight ---
        for (unsigned int n = 0; n < aha->mNumWeights;++n) {
            if  (aha->mWeights[n].mVertexId != oha->mWeights[n].mVertexId ||
                (aha->mWeights[n].mWeight - oha->mWeights[n].mWeight) < 10e-3f) {
                return false;
            }
        }
    }
    return true;
}